

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  long lVar3;
  ImGuiContext *pIVar4;
  ImGuiPopupData *pIVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int remaining;
  long lVar9;
  
  pIVar4 = GImGui;
  uVar8 = (GImGui->BeginPopupStack).Size;
  if ((0 < (int)uVar8) && ((int)uVar8 <= (GImGui->OpenPopupStack).Size)) {
    uVar7 = (ulong)(uVar8 - 1);
    pIVar5 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar7].PopupId == pIVar5[uVar7].PopupId) {
      if (uVar8 != 1) {
        lVar9 = (ulong)(uVar8 - 2) * 0x30 + 8;
        do {
          remaining = (int)uVar7;
          uVar1 = uVar8 - 1;
          iVar6 = (pIVar4->OpenPopupStack).Size;
          if (iVar6 <= (int)uVar1) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            pIVar5 = (pIVar4->OpenPopupStack).Data;
            iVar6 = (pIVar4->OpenPopupStack).Size;
          }
          pIVar2 = pIVar5[uVar1].Window;
          if (iVar6 < (int)uVar1) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            pIVar5 = (pIVar4->OpenPopupStack).Data;
          }
          if (pIVar2 == (ImGuiWindow *)0x0) {
            remaining = uVar8 - 1;
            goto LAB_0020fdcf;
          }
          if (((pIVar2->Flags & 0x10000000) == 0) ||
             ((lVar3 = *(long *)((long)&pIVar5->PopupId + lVar9), lVar3 != 0 &&
              ((*(byte *)(lVar3 + 0xf) & 8) != 0)))) goto LAB_0020fdcf;
          lVar9 = lVar9 + -0x30;
          uVar7 = (ulong)(remaining - 1);
          uVar8 = uVar1;
        } while (1 < (int)uVar1);
      }
      remaining = 0;
LAB_0020fdcf:
      ClosePopupToLevel(remaining,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    //IMGUI_DEBUG_LOG("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}